

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O1

void __thiscall
BayesianGameCollaborativeGraphical::RecurseOverAgents
          (BayesianGameCollaborativeGraphical *this,Index currentAgent,
          vector<bool,_std::allocator<bool>_> *agentVisited)

{
  Index i;
  vector<bool,_std::allocator<bool>_> *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  reference rVar8;
  Scope neighbors;
  Scope lrfScope;
  Scope local_78;
  Index local_54;
  Scope local_50;
  vector<bool,_std::allocator<bool>_> *local_38;
  
  local_38 = agentVisited;
  rVar8 = std::vector<bool,_std::allocator<bool>_>::at(agentVisited,(ulong)currentAgent);
  *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
  local_78.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_78.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  uVar4 = 0;
  do {
    iVar2 = (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[0x15])(this);
    this_00 = local_38;
    if (CONCAT44(extraout_var,iVar2) == uVar4) {
      if ((long)local_78.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_78.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != 0) {
        uVar4 = (long)local_78.super_SDT.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_78.super_SDT.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        uVar5 = 1;
        uVar6 = 0;
        do {
          if (uVar4 <= uVar6) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar6);
          }
          rVar8 = std::vector<bool,_std::allocator<bool>_>::at
                            (this_00,(ulong)local_78.super_SDT.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar6]);
          if ((*rVar8._M_p & rVar8._M_mask) == 0) {
            if ((ulong)((long)local_78.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_78.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar6) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar6);
            }
            RecurseOverAgents(this,local_78.super_SDT.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar6],this_00);
          }
          uVar6 = (ulong)uVar5;
          uVar4 = (long)local_78.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_78.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar6);
      }
      if (local_78.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[0x16])(&local_50,this,uVar4);
    bVar1 = Scope::Contains(&local_50,currentAgent);
    if (bVar1) {
      if ((long)local_50.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_50.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != 0) {
        uVar3 = (long)local_50.super_SDT.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_50.super_SDT.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        uVar6 = 0;
        uVar7 = 1;
        do {
          if (uVar3 <= uVar6) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          i = local_50.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar6];
          if (i != currentAgent) {
            bVar1 = Scope::Contains(&local_78,i);
            if (!bVar1) {
              local_54 = i;
              if (local_78.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_78.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
                           (iterator)
                           local_78.super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_54);
              }
              else {
                *local_78.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish = i;
                local_78.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_78.super_SDT.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
          }
          uVar3 = (long)local_50.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_50.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2;
          bVar1 = uVar3 != uVar7;
          uVar6 = uVar7;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (bVar1);
      }
    }
    if (local_50.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super_SDT.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar4 = (ulong)((int)uVar4 + 1);
  } while( true );
}

Assistant:

void BayesianGameCollaborativeGraphical::RecurseOverAgents(Index currentAgent,
                                                 vector<bool> &agentVisited) const
{
    agentVisited.at(currentAgent)=true;
    Scope neighbors;
    for(Index e=0;e!=GetNrLRFs();++e)
    {
        Scope lrfScope=GetScope(e);
        if(lrfScope.Contains(currentAgent))
        {
            for(Index i=0;i!=lrfScope.size();++i)
            {
                Index ag=lrfScope.at(i);
                if(ag!=currentAgent &&
                   !neighbors.Contains(ag))
                    neighbors.Insert(ag);
            }
        }
    }
    for(Index i=0;i!=neighbors.size();++i)
        if(!agentVisited.at(neighbors.at(i)))
            RecurseOverAgents(neighbors.at(i),agentVisited);
}